

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O0

void __thiscall Variable_setInitialValue_Test::TestBody(Variable_setInitialValue_Test *this)

{
  bool bVar1;
  element_type *peVar2;
  char *pcVar3;
  AssertHelper local_98 [8];
  Message local_90 [8];
  undefined1 local_88 [8];
  AssertionResult gtest_ar;
  string a;
  allocator<char> local_41;
  undefined1 local_40 [8];
  string e;
  VariablePtr v;
  Variable_setInitialValue_Test *this_local;
  
  libcellml::Variable::create();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_40,"0.0",&local_41);
  std::allocator<char>::~allocator(&local_41);
  peVar2 = std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)(e.field_2._M_local_buf + 8));
  libcellml::Variable::setInitialValue((string *)peVar2);
  std::__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             (e.field_2._M_local_buf + 8));
  libcellml::Variable::initialValue_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_88,"e","a",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar.message_
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
  if (!bVar1) {
    testing::Message::Message(local_90);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_88);
    testing::internal::AssertHelper::AssertHelper
              (local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x101,pcVar3);
    testing::internal::AssertHelper::operator=(local_98,local_90);
    testing::internal::AssertHelper::~AssertHelper(local_98);
    testing::Message::~Message(local_90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
  std::__cxx11::string::~string((string *)&gtest_ar.message_);
  std::__cxx11::string::~string((string *)local_40);
  std::shared_ptr<libcellml::Variable>::~shared_ptr
            ((shared_ptr<libcellml::Variable> *)((long)&e.field_2 + 8));
  return;
}

Assistant:

TEST(Variable, setInitialValue)
{
    libcellml::VariablePtr v = libcellml::Variable::create();
    const std::string e = "0.0";
    v->setInitialValue(e);
    const std::string a = v->initialValue();
    EXPECT_EQ(e, a);
}